

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_scriptedmarine.cpp
# Opt level: O2

void __thiscall AScriptedMarine::SetWeapon(AScriptedMarine *this,EMarineWeapon type)

{
  bool bVar1;
  PClass *pPVar2;
  FDecalBase *pFVar3;
  
  bVar1 = GetWeaponStates(this,type,&(this->super_AActor).MeleeState,
                          &(this->super_AActor).MissileState);
  if (bVar1) {
    pPVar2 = PClass::FindClass(_ZZN15AScriptedMarine9SetWeaponENS_13EMarineWeaponEE7classes_rel +
                               *(int *)(
                                       _ZZN15AScriptedMarine9SetWeaponENS_13EMarineWeaponEE7classes_rel
                                       + (ulong)type * 4));
    if (pPVar2 == (PClass *)0x0) {
      pFVar3 = (FDecalBase *)0x0;
    }
    else {
      pFVar3 = *(FDecalBase **)(pPVar2->Defaults + 0x438);
    }
    (this->super_AActor).DecalGenerator = pFVar3;
  }
  return;
}

Assistant:

void AScriptedMarine::SetWeapon (EMarineWeapon type)
{
	if (GetWeaponStates(type, MeleeState, MissileState))
	{
		static const char *classes[] = {
			"ScriptedMarine",
			"MarineFist",
			"MarineBerserk",
			"MarineChainsaw",
			"MarinePistol",
			"MarineShotgun",
			"MarineSSG",
			"MarineChaingun",
			"MarineRocket",
			"MarinePlasma",
			"MarineRailgun",
			"MarineBFG"
		};

		const PClass *cls = PClass::FindClass(classes[type]);
		if (cls != NULL)
			DecalGenerator = GetDefaultByType(cls)->DecalGenerator;
		else 
			DecalGenerator = NULL;
	}
}